

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# storage.c
# Opt level: O1

void read_random_seed(noise_consumer_t consumer)

{
  int __fd;
  int iVar1;
  char *__file;
  ssize_t sVar2;
  char buf [512];
  undefined1 auStack_218 [512];
  
  __file = make_filename(3,(char *)0x0);
  __fd = open(__file,0);
  safefree(__file);
  if (-1 < __fd) {
    sVar2 = read(__fd,auStack_218,0x200);
    iVar1 = (int)sVar2;
    while (0 < iVar1) {
      (*consumer)(auStack_218,(int)sVar2);
      sVar2 = read(__fd,auStack_218,0x200);
      iVar1 = (int)sVar2;
    }
    close(__fd);
  }
  return;
}

Assistant:

void read_random_seed(noise_consumer_t consumer)
{
    int fd;
    char *fname;

    fname = make_filename(INDEX_RANDSEED, NULL);
    fd = open(fname, O_RDONLY);
    sfree(fname);
    if (fd >= 0) {
        char buf[512];
        int ret;
        while ( (ret = read(fd, buf, sizeof(buf))) > 0)
            consumer(buf, ret);
        close(fd);
    }
}